

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

void ensure_writev_room(estate s,int add_count)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  internal_iovec *piVar4;
  undefined8 uVar5;
  internal_iovec *piVar6;
  long lVar7;
  
  iVar3 = s->malloc_vec_size;
  if ((long)iVar3 == 0) {
    if (0x61 < s->iovcnt) {
      piVar6 = (internal_iovec *)ffs_malloc(0x12f0);
      s->malloc_vec_size = 0xca;
      iVar3 = s->iovcnt;
      if (0 < (long)iVar3) {
        piVar4 = s->iovec;
        lVar7 = 0;
        do {
          *(undefined8 *)((long)&piVar6->iov_base + lVar7) =
               *(undefined8 *)((long)&piVar4->iov_base + lVar7);
          puVar1 = (undefined8 *)((long)&piVar4->iov_offset + lVar7);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&piVar6->iov_offset + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar7 = lVar7 + 0x18;
        } while ((long)iVar3 * 0x18 != lVar7);
      }
      s->iovec = piVar6;
      s->iovec_is_stack = 0;
    }
  }
  else if (iVar3 + -2 <= s->iovcnt) {
    s->malloc_vec_size = iVar3 * 2;
    piVar6 = (internal_iovec *)ffs_realloc(s->iovec,(long)iVar3 * 0x30);
    s->iovec = piVar6;
  }
  return;
}

Assistant:

static void
ensure_writev_room(estate s, int add_count)
{
    /* 
     * we need to track the length of the strings we're writing
     * assume a small number (STACK_ARRAY_SIZE) but expand
     * dynamically if we have more...  
     */
    if (!(s->malloc_vec_size) &&
	(s->iovcnt >= STACK_ARRAY_SIZE - add_count)) {
	int j;
	internal_iovec *tmpl = (internal_iovec *)
	    malloc(sizeof(internal_iovec) * (2 * STACK_ARRAY_SIZE + add_count));
	s->malloc_vec_size = (2 * STACK_ARRAY_SIZE + add_count);
	for (j = 0; j < s->iovcnt; j++) {
	    tmpl[j].iov_len = (s->iovec)[j].iov_len;
	    tmpl[j].iov_base = (s->iovec)[j].iov_base;
	    tmpl[j].iov_offset = (s->iovec)[j].iov_offset;
	}
	s->iovec = tmpl;
	s->iovec_is_stack = 0;
    } else if ((s->malloc_vec_size != 0) &&
	       (s->iovcnt >= s->malloc_vec_size - add_count)) {
	(s->malloc_vec_size) *= 2;
	s->iovec = realloc(s->iovec, sizeof(internal_iovec) *
				(s->malloc_vec_size));
    }
}